

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::map_onto<signed_char>
          (Omega_h *this,Read<signed_char> *a_data,LOs *a2b,LO nb,char init_val,Int width)

{
  Alloc *pAVar1;
  int iVar2;
  int iVar3;
  void *extraout_RDX;
  Read<signed_char> RVar4;
  Write<signed_char> out;
  Write<signed_char> local_b0;
  Write<signed_char> local_a0;
  Write<int> local_90;
  Write<signed_char> local_80;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_50);
  Write<signed_char>::Write(&out,nb * width,init_val,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (((ulong)out.shared_alloc_.alloc & 1) == 0) {
    iVar2 = (int)(out.shared_alloc_.alloc)->size;
  }
  else {
    iVar2 = (int)((ulong)out.shared_alloc_.alloc >> 3);
  }
  pAVar1 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    iVar3 = (int)pAVar1->size;
  }
  else {
    iVar3 = (int)((ulong)pAVar1 >> 3);
  }
  if (iVar2 < iVar3) {
    if (((ulong)out.shared_alloc_.alloc & 1) == 0) {
      iVar2 = (int)(out.shared_alloc_.alloc)->size;
    }
    else {
      iVar2 = (int)((ulong)out.shared_alloc_.alloc >> 3);
    }
    std::__cxx11::to_string(&local_70,iVar2);
    pAVar1 = (a_data->write_).shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      iVar2 = (int)pAVar1->size;
    }
    else {
      iVar2 = (int)((ulong)pAVar1 >> 3);
    }
    std::__cxx11::to_string(&local_50,iVar2);
    printf("ERROR: !( %s %s %s ) : ! ( %s %s %s )\n","out.size()",">=","a_data.size()",
           local_70._M_dataplus._M_p,">=",local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (((ulong)out.shared_alloc_.alloc & 1) == 0) {
    iVar2 = (int)(out.shared_alloc_.alloc)->size;
  }
  else {
    iVar2 = (int)((ulong)out.shared_alloc_.alloc >> 3);
  }
  pAVar1 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    iVar3 = (int)pAVar1->size;
  }
  else {
    iVar3 = (int)((ulong)pAVar1 >> 3);
  }
  if (iVar3 <= iVar2) {
    Write<signed_char>::Write(&local_80,&a_data->write_);
    Write<int>::Write(&local_90,&a2b->write_);
    Write<signed_char>::Write(&local_a0,&out);
    map_into<signed_char>((Read<signed_char> *)&local_80,(LOs *)&local_90,&local_a0,width);
    Write<signed_char>::~Write(&local_a0);
    Write<int>::~Write(&local_90);
    Write<signed_char>::~Write(&local_80);
    Write<signed_char>::Write(&local_b0,&out);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_b0);
    Write<signed_char>::~Write(&local_b0);
    Write<signed_char>::~Write(&out);
    RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar4.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","(out.size()) >= (a_data.size())",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x45);
}

Assistant:

Read<T> map_onto(Read<T> a_data, LOs a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  OMEGA_H_CHECK_OP(out.size(), >=, a_data.size());
  map_into(a_data, a2b, out, width);
  return out;
}